

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::
          basic_constructors<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>
                    (string *type,ModulePtr *m)

{
  Proxy_Function *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  ModulePtr MVar1;
  string *in_stack_ffffffffffffff60;
  shared_ptr<chaiscript::Module> *this;
  element_type *this_00;
  shared_ptr<chaiscript::Module> local_78 [2];
  ModulePtr *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  
  this_00 = in_RDI;
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4166ce);
  constructor<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>()>();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,in_RSI);
  Module::add(this_00,in_RDX,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x416724);
  this = local_78;
  std::shared_ptr<chaiscript::Module>::shared_ptr(this,(shared_ptr<chaiscript::Module> *)in_RSI);
  copy_constructor<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x416763);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x41676d);
  std::shared_ptr<chaiscript::Module>::shared_ptr(this,(shared_ptr<chaiscript::Module> *)in_RSI);
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr basic_constructors(const std::string &type, ModulePtr m = std::make_shared<Module>())
    {
      m->add(constructor<T ()>(), type);
      copy_constructor<T>(type, m);
      return m;
    }